

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayof.c
# Opt level: O3

void tommy_arrayof_init(tommy_arrayof *array,tommy_size_t element_size)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  void *pvVar4;
  long lVar5;
  long in_FS_OFFSET;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  array->element_size = element_size;
  array->bucket_bit = 6;
  array->bucket_max = 0x40;
  pvVar4 = lrtr_calloc(0x40,element_size);
  array->bucket[0] = pvVar4;
  auVar3 = _DAT_00109020;
  auVar2 = _DAT_00109010;
  lVar5 = 0;
  iVar6 = (int)DAT_00109030;
  iVar7 = DAT_00109030._4_4_;
  do {
    auVar8._8_4_ = (int)lVar5;
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar8 = (auVar8 | auVar2) ^ auVar3;
    if (auVar8._4_4_ == iVar7 && auVar8._0_4_ < iVar6) {
      array->bucket[lVar5 + 1] = pvVar4;
      array->bucket[lVar5 + 2] = pvVar4;
    }
    lVar5 = lVar5 + 2;
  } while (lVar5 != 6);
  array->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void tommy_arrayof_init(tommy_arrayof* array, tommy_size_t element_size)
{
	tommy_uint_t i;

	/* fixed initial size */
	array->element_size = element_size;
	array->bucket_bit = TOMMY_ARRAYOF_BIT;
	array->bucket_max = 1 << array->bucket_bit;
	array->bucket[0] = tommy_calloc(array->bucket_max, array->element_size);
	for (i = 1; i < TOMMY_ARRAYOF_BIT; ++i)
		array->bucket[i] = array->bucket[0];

	array->count = 0;
}